

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmCodeTests.cpp
# Opt level: O0

void assembler::anon_unknown_1::asmcode_byte_boundary(void)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
  *plVar1;
  reference pvVar2;
  reference pvVar3;
  uint64_t uVar4;
  allocator<unsigned_char> local_29b;
  uchar local_29a [10];
  iterator local_290;
  size_type local_288;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_280;
  allocator<unsigned_char> local_261;
  uchar local_260 [8];
  iterator local_258;
  size_type local_250;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_248;
  allocator<unsigned_char> local_22e;
  uchar local_22d [5];
  iterator local_228;
  size_type local_220;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_218;
  allocator<unsigned_char> local_1fd;
  uchar local_1fc [4];
  iterator local_1f8;
  size_type local_1f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  allocator<unsigned_char> local_1d0;
  uchar local_1cf [7];
  iterator local_1c8;
  size_type local_1c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b8;
  uint64_t local_1a0;
  uint64_t size;
  operand local_190 [2];
  operation local_188;
  operand local_184 [3];
  operation local_178;
  operand local_174 [3];
  operation local_168;
  operand local_164 [3];
  operation local_158 [4];
  operand local_148 [3];
  operation local_13c;
  uint8_t local_138 [8];
  uint8_t buffer [255];
  asmcode code;
  
  assembler::asmcode::asmcode((asmcode *)(buffer + 0xf8));
  local_13c = MOV;
  local_148[2] = 0x1a;
  local_148[1] = 0x80;
  local_148[0] = RAX;
  asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            ((asmcode *)(buffer + 0xf8),&local_13c,local_148 + 2,(int *)(local_148 + 1),local_148);
  local_158[0] = MOV;
  local_164[2] = 0x1a;
  local_164[1] = 0xffffff80;
  local_164[0] = RAX;
  asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            ((asmcode *)(buffer + 0xf8),local_158,local_164 + 2,(int *)(local_164 + 1),local_164);
  local_168 = MOV;
  local_174[2] = 0x1f;
  local_174[1] = 0xffffff80;
  local_174[0] = RAX;
  asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            ((asmcode *)(buffer + 0xf8),&local_168,local_174 + 2,(int *)(local_174 + 1),local_174);
  local_178 = MOV;
  local_184[2] = 0x1f;
  local_184[1] = 0x80;
  local_184[0] = RAX;
  asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            ((asmcode *)(buffer + 0xf8),&local_178,local_184 + 2,(int *)(local_184 + 1),local_184);
  local_188 = MOV;
  local_190[1] = 9;
  local_190[0] = NUMBER;
  size._4_4_ = 0xffffffff;
  asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_int>
            ((asmcode *)(buffer + 0xf8),&local_188,local_190 + 1,local_190,(uint *)((long)&size + 4)
            );
  plVar1 = (list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
            *)assembler::asmcode::get_instructions_list_abi_cxx11_();
  pvVar2 = std::__cxx11::
           list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
           ::front(plVar1);
  pvVar3 = std::
           vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
           ::operator[](pvVar2,0);
  uVar4 = assembler::asmcode::instruction::fill_opcode((uchar *)pvVar3);
  local_1cf[0] = 'H';
  local_1cf[1] = 0x89;
  local_1cf[2] = 0x83;
  local_1cf[3] = 0x80;
  local_1cf[4] = 0;
  local_1cf[5] = 0;
  local_1cf[6] = 0;
  local_1c8 = local_1cf;
  local_1c0 = 7;
  local_1a0 = uVar4;
  std::allocator<unsigned_char>::allocator(&local_1d0);
  __l_03._M_len = local_1c0;
  __l_03._M_array = local_1c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1b8,__l_03,&local_1d0);
  _check_buffer(local_138,uVar4,&local_1b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1b8);
  std::allocator<unsigned_char>::~allocator(&local_1d0);
  plVar1 = (list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
            *)assembler::asmcode::get_instructions_list_abi_cxx11_();
  pvVar2 = std::__cxx11::
           list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
           ::front(plVar1);
  pvVar3 = std::
           vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
           ::operator[](pvVar2,1);
  uVar4 = assembler::asmcode::instruction::fill_opcode((uchar *)pvVar3);
  local_1fc[0] = 'H';
  local_1fc[1] = 0x89;
  local_1fc[2] = 0x43;
  local_1fc[3] = 0x80;
  local_1f8 = local_1fc;
  local_1f0 = 4;
  local_1a0 = uVar4;
  std::allocator<unsigned_char>::allocator(&local_1fd);
  __l_02._M_len = local_1f0;
  __l_02._M_array = local_1f8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1e8,__l_02,&local_1fd);
  _check_buffer(local_138,uVar4,&local_1e8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1e8);
  std::allocator<unsigned_char>::~allocator(&local_1fd);
  plVar1 = (list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
            *)assembler::asmcode::get_instructions_list_abi_cxx11_();
  pvVar2 = std::__cxx11::
           list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
           ::front(plVar1);
  pvVar3 = std::
           vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
           ::operator[](pvVar2,2);
  uVar4 = assembler::asmcode::instruction::fill_opcode((uchar *)pvVar3);
  local_22d[0] = 'H';
  local_22d[1] = 0x89;
  local_22d[2] = 0x44;
  local_22d[3] = 0x24;
  local_22d[4] = 0x80;
  local_228 = local_22d;
  local_220 = 5;
  local_1a0 = uVar4;
  std::allocator<unsigned_char>::allocator(&local_22e);
  __l_01._M_len = local_220;
  __l_01._M_array = local_228;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_218,__l_01,&local_22e);
  _check_buffer(local_138,uVar4,&local_218);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_218);
  std::allocator<unsigned_char>::~allocator(&local_22e);
  plVar1 = (list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
            *)assembler::asmcode::get_instructions_list_abi_cxx11_();
  pvVar2 = std::__cxx11::
           list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
           ::front(plVar1);
  pvVar3 = std::
           vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
           ::operator[](pvVar2,3);
  uVar4 = assembler::asmcode::instruction::fill_opcode((uchar *)pvVar3);
  local_260[0] = 'H';
  local_260[1] = 0x89;
  local_260[2] = 0x84;
  local_260[3] = 0x24;
  local_260[4] = 0x80;
  local_260[5] = 0;
  local_260[6] = 0;
  local_260[7] = 0;
  local_258 = local_260;
  local_250 = 8;
  local_1a0 = uVar4;
  std::allocator<unsigned_char>::allocator(&local_261);
  __l_00._M_len = local_250;
  __l_00._M_array = local_258;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_248,__l_00,&local_261);
  _check_buffer(local_138,uVar4,&local_248);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_248);
  std::allocator<unsigned_char>::~allocator(&local_261);
  plVar1 = (list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
            *)assembler::asmcode::get_instructions_list_abi_cxx11_();
  pvVar2 = std::__cxx11::
           list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
           ::front(plVar1);
  pvVar3 = std::
           vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
           ::operator[](pvVar2,4);
  uVar4 = assembler::asmcode::instruction::fill_opcode((uchar *)pvVar3);
  local_29a[0] = 'H';
  local_29a[1] = 0xb8;
  local_29a[2] = 0xff;
  local_29a[3] = 0xff;
  local_29a[4] = 0xff;
  local_29a[5] = 0xff;
  local_29a[6] = 0;
  local_29a[7] = 0;
  local_29a[8] = 0;
  local_29a[9] = 0;
  local_290 = local_29a;
  local_288 = 10;
  local_1a0 = uVar4;
  std::allocator<unsigned_char>::allocator(&local_29b);
  __l._M_len = local_288;
  __l._M_array = local_290;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_280,__l,&local_29b);
  _check_buffer(local_138,uVar4,&local_280);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_280);
  std::allocator<unsigned_char>::~allocator(&local_29b);
  assembler::asmcode::~asmcode((asmcode *)(buffer + 0xf8));
  return;
}

Assistant:

void asmcode_byte_boundary()
    {
    asmcode code; uint8_t buffer[255];
    code.add(asmcode::MOV, asmcode::MEM_RBX, 128, asmcode::RAX);
    code.add(asmcode::MOV, asmcode::MEM_RBX, -128, asmcode::RAX);
    code.add(asmcode::MOV, asmcode::MEM_RSP, -128, asmcode::RAX);
    code.add(asmcode::MOV, asmcode::MEM_RSP, 128, asmcode::RAX);
    code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, 0x00000000ffffffff);

    uint64_t size;
    size = code.get_instructions_list().front()[0].fill_opcode(buffer);
    _check_buffer(buffer, size, { 0x48, 0x89, 0x83, 0x80, 0x00, 0x00, 0x00 });
    size = code.get_instructions_list().front()[1].fill_opcode(buffer);
    _check_buffer(buffer, size, { 0x48, 0x89, 0x43, 0x80 });
    size = code.get_instructions_list().front()[2].fill_opcode(buffer);
    _check_buffer(buffer, size, { 0x48, 0x89, 0x44, 0x24, 0x80 });
    size = code.get_instructions_list().front()[3].fill_opcode(buffer);
    _check_buffer(buffer, size, { 0x48, 0x89, 0x84, 0x24, 0x80, 0x00, 0x00, 0x00 });

    size = code.get_instructions_list().front()[4].fill_opcode(buffer);
    _check_buffer(buffer, size, { 0x48, 0xB8, 0xFF, 0xFF, 0xFF, 0xFF, 0x00, 0x00, 0x00, 0x00 });
    }